

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall ON_BinaryArchive::Read3dmMaterial(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  ON_Material *pOVar1;
  bool bVar2;
  int iVar3;
  ON_Material *this_00;
  int iVar4;
  ON_Material *V1_material;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Material *local_48;
  uint local_3c;
  ON__INT64 local_38;
  
  bVar2 = Read3dmTableRecord(this,material_table,ppMaterial);
  iVar3 = 0;
  if (bVar2) {
    local_3c = 0;
    local_38 = 0;
    if (this->m_3dm_version == 1) {
      local_48 = (ON_Material *)0x0;
      iVar3 = Read3dmV1Material(this,&local_48);
      if (local_48 != (ON_Material *)0x0) {
        bVar2 = ON_ModelComponent::IdIsNil(&local_48->super_ON_ModelComponent);
        if (bVar2) {
          ON_ModelComponent::SetId(&local_48->super_ON_ModelComponent);
        }
        Internal_Read3dmUpdateManifest(this,&local_48->super_ON_ModelComponent);
        if (ppMaterial == (ON_Material **)0x0) {
          if (local_48 != (ON_Material *)0x0) {
            (*(local_48->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
          }
        }
        else {
          *ppMaterial = local_48;
        }
      }
    }
    else {
      bVar2 = BeginRead3dmBigChunk(this,&local_3c,&local_38);
      iVar3 = -1;
      if (bVar2) {
        if (local_3c == 0xffffffff) {
          iVar4 = 0;
        }
        else if (local_3c == 0x20008040) {
          Internal_Increment3dmTableItemCount(this);
          local_48 = (ON_Material *)0x0;
          iVar3 = ReadObjectHelper(this,(ON_Object **)&local_48);
          pOVar1 = local_48;
          bVar2 = true;
          iVar4 = -1;
          if (iVar3 != 0) {
            this_00 = ON_Material::Cast((ON_Object *)local_48);
            if (this_00 == (ON_Material *)0x0) {
              if (pOVar1 != (ON_Material *)0x0) {
                (*(pOVar1->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(pOVar1);
              }
            }
            else {
              bVar2 = ON_ModelComponent::IdIsNil(&this_00->super_ON_ModelComponent);
              if (bVar2) {
                ON_ModelComponent::SetId(&this_00->super_ON_ModelComponent);
              }
              Internal_Read3dmUpdateManifest(this,&this_00->super_ON_ModelComponent);
              iVar4 = 1;
              if (ppMaterial != (ON_Material **)0x0) {
                *ppMaterial = this_00;
              }
              bVar2 = false;
            }
          }
          if (bVar2) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x31e2,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x31ec,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
          iVar4 = -1;
        }
        bVar2 = EndRead3dmChunk(this,false);
        iVar3 = -1;
        if (bVar2) {
          iVar3 = iVar4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int ON_BinaryArchive::Read3dmMaterial( ON_Material** ppMaterial )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::material_table, (void**)ppMaterial))
    return 0;

  int rc;
  ON_Material* material = nullptr;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( m_3dm_version == 1 ) 
  {
    ON_Material* V1_material = nullptr;
    rc = ON_BinaryArchive::Read3dmV1Material( &V1_material );
    if (nullptr != V1_material)
    {
      if ( V1_material->IdIsNil() )
        V1_material->SetId();
      Internal_Read3dmUpdateManifest(*V1_material);
      if (ppMaterial)
        *ppMaterial = V1_material;
      else
        delete V1_material;
    }
  }
  else 
  {
    // version 2+
    rc = -1;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_MATERIAL_RECORD ) 
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) ) 
        {
          material = ON_Material::Cast(p);
          if ( !material )
            delete p;
          else 
          {
            if ( material->IdIsNil() )
              material->SetId();
            Internal_Read3dmUpdateManifest(*material);
            if ( ppMaterial )
              *ppMaterial = material;
            rc = 1;
          }
        }
        if (!material)
        {
          ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
        }
      }
      else if ( tcode == TCODE_ENDOFTABLE ) 
      {
        // end of material table
        rc = 0;
      }
      else 
      {
        ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
      }
      if ( !EndRead3dmChunk() )
        rc = -1;
    }
  }
  return rc;
}